

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Get(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  Gia_Man_t *p;
  Gia_Man_t *pNew;
  Vec_Ptr_t *pVVar6;
  float *pfVar7;
  Vec_Flt_t *pVVar8;
  char *pcVar9;
  uint fGiaSimple;
  char *pcVar10;
  uint fVerbose;
  Abc_Ntk_t *pNtk;
  float fVar11;
  
  fGiaSimple = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  bVar2 = false;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"cmnvh"), iVar3 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar3 < 0x6d) break;
      if (iVar3 == 0x6d) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar3 != 0x6e) goto LAB_00275cbf;
        bVar2 = (bool)(bVar2 ^ 1);
      }
    }
    if (iVar3 == -1) {
      pAVar5 = pAbc->pNtkCur;
      if (pAVar5 != (Abc_Ntk_t *)0x0) {
        if (pAVar5->ntkType == ABC_NTK_STRASH) {
          iVar3 = Abc_NtkGetChoiceNum(pAVar5);
          if (iVar3 == 0) {
            pAVar4 = Abc_NtkToDar(pAbc->pNtkCur,0,1);
          }
          else {
            pAVar4 = Abc_NtkToDarChoices(pAbc->pNtkCur);
          }
          pNew = Gia_ManFromAig(pAVar4);
          Aig_ManStop(pAVar4);
        }
        else if (bVar1 || fGiaSimple != 0) {
          if (pAVar5->ntkType != ABC_NTK_LOGIC) {
            __assert_fail("Abc_NtkIsLogic(pAbc->pNtkCur)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                          ,0x76c4,"int Abc_CommandAbc9Get(Abc_Frame_t *, int, char **)");
          }
          Abc_NtkToAig(pAVar5);
          pNew = Abc_NtkAigToGia(pAbc->pNtkCur,fGiaSimple);
        }
        else {
          pAVar5 = Abc_NtkStrash(pAVar5,0,1,0);
          pAVar4 = Abc_NtkToDar(pAVar5,0,0);
          Abc_NtkDelete(pAVar5);
          p = Gia_ManFromAig(pAVar4);
          Aig_ManStop(pAVar4);
          pcVar9 = Abc_NtkCollectLatchValuesStr(pAbc->pNtkCur);
          pNew = Gia_ManDupZeroUndc(p,pcVar9,0,0,fVerbose);
          Gia_ManStop(p);
          if (pcVar9 != (char *)0x0) {
            free(pcVar9);
          }
        }
        if (bVar2) {
          pVVar6 = Abc_NtkCollectCiNames(pAbc->pNtkCur);
          pNew->vNamesIn = pVVar6;
          pVVar6 = Abc_NtkCollectCoNames(pAbc->pNtkCur);
          pNew->vNamesOut = pVVar6;
        }
        pAVar5 = pAbc->pNtkCur;
        if (pAVar5->pManTime != (Abc_ManTime_t *)0x0) {
          if (pNew->vInArrs != (Vec_Flt_t *)0x0) {
            pfVar7 = pNew->vInArrs->pArray;
            if (pfVar7 != (float *)0x0) {
              free(pfVar7);
              pNew->vInArrs->pArray = (float *)0x0;
            }
            if (pNew->vInArrs != (Vec_Flt_t *)0x0) {
              free(pNew->vInArrs);
              pNew->vInArrs = (Vec_Flt_t *)0x0;
            }
          }
          if (pNew->vOutReqs != (Vec_Flt_t *)0x0) {
            pfVar7 = pNew->vOutReqs->pArray;
            if (pfVar7 != (float *)0x0) {
              free(pfVar7);
              pNew->vOutReqs->pArray = (float *)0x0;
            }
            if (pNew->vOutReqs != (Vec_Flt_t *)0x0) {
              free(pNew->vOutReqs);
              pNew->vOutReqs = (Vec_Flt_t *)0x0;
            }
          }
          fVar11 = Abc_NtkReadDefaultArrivalWorst(pAVar5);
          pNew->DefInArrs = fVar11;
          fVar11 = Abc_NtkReadDefaultRequiredWorst(pAVar5);
          pNew->DefOutReqs = fVar11;
          pfVar7 = Abc_NtkGetCiArrivalFloats(pAVar5);
          iVar3 = pAVar5->vCis->nSize;
          pVVar8 = (Vec_Flt_t *)malloc(0x10);
          pVVar8->nSize = iVar3;
          pVVar8->nCap = iVar3;
          pVVar8->pArray = pfVar7;
          pNew->vInArrs = pVVar8;
          pfVar7 = Abc_NtkGetCoRequiredFloats(pAVar5);
          iVar3 = pAVar5->vCos->nSize;
          pVVar8 = (Vec_Flt_t *)malloc(0x10);
          pVVar8->nSize = iVar3;
          pVVar8->nCap = iVar3;
          pVVar8->pArray = pfVar7;
          pNew->vOutReqs = pVVar8;
          pNew->And2Delay = (int)pAVar5->AndGateDelay;
        }
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar9 = "There is no current network\n";
      iVar3 = -1;
      goto LAB_00275dee;
    }
    if (iVar3 != 99) break;
    fGiaSimple = fGiaSimple ^ 1;
  }
LAB_00275cbf:
  Abc_Print(-2,"usage: &get [-cmnvh] <file>\n");
  Abc_Print(-2,"\t         converts the current network into GIA and moves it to the &-space\n");
  Abc_Print(-2,"\t         (if the network is a sequential logic network, normalizes the flops\n");
  Abc_Print(-2,"\t         to have const-0 initial values, equivalent to \"undc; st; zero\")\n");
  pcVar10 = "yes";
  pcVar9 = "yes";
  if (fGiaSimple == 0) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-c     : toggles allowing simple GIA to be imported [default = %s]\n",pcVar9);
  pcVar9 = "yes";
  if (!bVar1) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-m     : toggles preserving the current mapping [default = %s]\n",pcVar9);
  pcVar9 = "yes";
  if (!bVar2) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-n     : toggles saving CI/CO names of the AIG [default = %s]\n",pcVar9);
  if (fVerbose == 0) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar10);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  pcVar9 = "\t<file> : the file name\n";
  iVar3 = -2;
LAB_00275dee:
  Abc_Print(iVar3,pcVar9);
  return 1;
}

Assistant:

int Abc_CommandAbc9Get( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Aig_Man_t * Abc_NtkToDarChoices( Abc_Ntk_t * pNtk );
    extern Vec_Ptr_t * Abc_NtkCollectCiNames( Abc_Ntk_t * pNtk );
    extern Vec_Ptr_t * Abc_NtkCollectCoNames( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pStrash;
    Aig_Man_t * pAig;
    Gia_Man_t * pGia, * pTemp;
    char * pInits;
    int c, fGiaSimple = 0, fMapped = 0, fNames = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cmnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 'm':
            fMapped ^= 1;
            break;
        case 'n':
            fNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( -1, "There is no current network\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash( pAbc->pNtkCur ) )
    {
        if ( fGiaSimple || fMapped )
        {
            assert( Abc_NtkIsLogic(pAbc->pNtkCur) );
            Abc_NtkToAig( pAbc->pNtkCur );
            pGia = Abc_NtkAigToGia( pAbc->pNtkCur, fGiaSimple );
        }
        else
        {
            // derive comb GIA
            pStrash = Abc_NtkStrash( pAbc->pNtkCur, 0, 1, 0 );
            pAig = Abc_NtkToDar( pStrash, 0, 0 );
            Abc_NtkDelete( pStrash );
            pGia = Gia_ManFromAig( pAig );
            Aig_ManStop( pAig );
            // perform undc/zero
            pInits = Abc_NtkCollectLatchValuesStr( pAbc->pNtkCur );
            pGia = Gia_ManDupZeroUndc( pTemp = pGia, pInits, 0, 0, fVerbose );
            Gia_ManStop( pTemp );
            ABC_FREE( pInits );
        }
    }
    else
    {
        if ( Abc_NtkGetChoiceNum(pAbc->pNtkCur) )
            pAig = Abc_NtkToDarChoices( pAbc->pNtkCur );
        else
            pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        pGia = Gia_ManFromAig( pAig );
        Aig_ManStop( pAig );
    }
    // copy names
    if ( fNames )
    {
        pGia->vNamesIn  = Abc_NtkCollectCiNames( pAbc->pNtkCur );
        pGia->vNamesOut = Abc_NtkCollectCoNames( pAbc->pNtkCur );
    }
    // copy user timing information
    if ( pAbc->pNtkCur->pManTime != NULL )
    {
        Abc_Ntk_t * pNtk = pAbc->pNtkCur;
        Vec_FltFreeP( &pGia->vInArrs );
        Vec_FltFreeP( &pGia->vOutReqs );
        pGia->DefInArrs  = Abc_NtkReadDefaultArrivalWorst(pNtk);
        pGia->DefOutReqs = Abc_NtkReadDefaultRequiredWorst(pNtk);
        pGia->vInArrs  = Vec_FltAllocArray( Abc_NtkGetCiArrivalFloats(pNtk), Abc_NtkCiNum(pNtk) );
        pGia->vOutReqs = Vec_FltAllocArray( Abc_NtkGetCoRequiredFloats(pNtk), Abc_NtkCoNum(pNtk) );
        pGia->And2Delay = pNtk->AndGateDelay;
    }
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &get [-cmnvh] <file>\n" );
    Abc_Print( -2, "\t         converts the current network into GIA and moves it to the &-space\n" );
    Abc_Print( -2, "\t         (if the network is a sequential logic network, normalizes the flops\n" );
    Abc_Print( -2, "\t         to have const-0 initial values, equivalent to \"undc; st; zero\")\n" );
    Abc_Print( -2, "\t-c     : toggles allowing simple GIA to be imported [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles preserving the current mapping [default = %s]\n", fMapped? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggles saving CI/CO names of the AIG [default = %s]\n", fNames? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}